

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O2

void player_over_exert(player *p,wchar_t flag,wchar_t chance,wchar_t amount)

{
  wchar_t wVar1;
  uint32_t uVar2;
  char dam_text [32];
  
  if (L'\0' < chance) {
    if (((flag & 1U) != 0) && (wVar1 = Rand_div(100), wVar1 < chance)) {
      uVar2 = Rand_div(100);
      msg("You have damaged your health!");
      player_stat_dec(p,L'\x04',0x31 < (uint)chance && (int)uVar2 < (int)((uint)chance >> 1));
    }
    if (((flag & 2U) != 0) && (wVar1 = Rand_div(100), wVar1 < chance)) {
      msg("You faint from the effort!");
      uVar2 = Rand_div(amount);
      player_inc_timed(p,L'\x03',uVar2 + L'\x01',true,true,false);
    }
    if (((flag & 4U) != 0) && (wVar1 = Rand_div(100), wVar1 < chance)) {
      uVar2 = Rand_div(amount);
      player_inc_timed(p,L'\x1f',uVar2 + L'\x01',true,true,true);
    }
    if (((flag & 8U) != 0) && (wVar1 = Rand_div(100), wVar1 < chance)) {
      msg("Wounds appear on your body!");
      uVar2 = Rand_div(amount);
      player_inc_timed(p,L'\b',uVar2 + L'\x01',true,true,false);
    }
    if (((flag & 0x10U) != 0) && (wVar1 = Rand_div(100), wVar1 < chance)) {
      uVar2 = Rand_div(amount);
      player_inc_timed(p,L'\x04',uVar2 + L'\x01',true,true,true);
    }
    if (((flag & 0x20U) != 0) && (wVar1 = Rand_div(100), wVar1 < chance)) {
      uVar2 = Rand_div(amount);
      player_inc_timed(p,L'\x06',uVar2 + L'\x01',true,true,true);
    }
    if (((flag & 0x40U) != 0) && (wVar1 = Rand_div(100), wVar1 < chance)) {
      msg("You feel suddenly lethargic.");
      uVar2 = Rand_div(amount);
      player_inc_timed(p,L'\x01',uVar2 + L'\x01',true,true,false);
    }
    if (((char)flag < '\0') && (wVar1 = Rand_div(100), wVar1 < chance)) {
      uVar2 = Rand_div(amount);
      wVar1 = player_apply_damage_reduction(p,uVar2 + L'\x01');
      dam_text[0x10] = '\0';
      dam_text[0x11] = '\0';
      dam_text[0x12] = '\0';
      dam_text[0x13] = '\0';
      dam_text[0x14] = '\0';
      dam_text[0x15] = '\0';
      dam_text[0x16] = '\0';
      dam_text[0x17] = '\0';
      dam_text[0x18] = '\0';
      dam_text[0x19] = '\0';
      dam_text[0x1a] = '\0';
      dam_text[0x1b] = '\0';
      dam_text[0x1c] = '\0';
      dam_text[0x1d] = '\0';
      dam_text[0x1e] = '\0';
      dam_text[0x1f] = '\0';
      dam_text[0] = '\0';
      dam_text[1] = '\0';
      dam_text[2] = '\0';
      dam_text[3] = '\0';
      dam_text[4] = '\0';
      dam_text[5] = '\0';
      dam_text[6] = '\0';
      dam_text[7] = '\0';
      dam_text[8] = '\0';
      dam_text[9] = '\0';
      dam_text[10] = '\0';
      dam_text[0xb] = '\0';
      dam_text[0xc] = '\0';
      dam_text[0xd] = '\0';
      dam_text[0xe] = '\0';
      dam_text[0xf] = '\0';
      if ((L'\0' < wVar1) && ((p->opts).opt[3] == true)) {
        strnfmt(dam_text,0x20," (%d)",(ulong)(uint)wVar1);
      }
      msg("You cry out in sudden pain!%s",dam_text);
      take_hit(p,wVar1,"over-exertion");
    }
  }
  return;
}

Assistant:

void player_over_exert(struct player *p, int flag, int chance, int amount)
{
	if (chance <= 0) return;

	/* CON damage */
	if (flag & PY_EXERT_CON) {
		if (randint0(100) < chance) {
			/* Hack - only permanent with high chance (no-mana casting) */
			bool perm = (randint0(100) < chance / 2) && (chance >= 50);
			msg("You have damaged your health!");
			player_stat_dec(p, STAT_CON, perm);
		}
	}

	/* Fainting */
	if (flag & PY_EXERT_FAINT) {
		if (randint0(100) < chance) {
			msg("You faint from the effort!");

			/* Bypass free action */
			(void)player_inc_timed(p, TMD_PARALYZED,
				randint1(amount), true, true, false);
		}
	}

	/* Scrambled stats */
	if (flag & PY_EXERT_SCRAMBLE) {
		if (randint0(100) < chance) {
			(void)player_inc_timed(p, TMD_SCRAMBLE,
				randint1(amount), true, true, true);
		}
	}

	/* Cut damage */
	if (flag & PY_EXERT_CUT) {
		if (randint0(100) < chance) {
			msg("Wounds appear on your body!");
			(void)player_inc_timed(p, TMD_CUT, randint1(amount),
				true, true, false);
		}
	}

	/* Confusion */
	if (flag & PY_EXERT_CONF) {
		if (randint0(100) < chance) {
			(void)player_inc_timed(p, TMD_CONFUSED,
				randint1(amount), true, true, true);
		}
	}

	/* Hallucination */
	if (flag & PY_EXERT_HALLU) {
		if (randint0(100) < chance) {
			(void)player_inc_timed(p, TMD_IMAGE, randint1(amount),
				true, true, true);
		}
	}

	/* Slowing */
	if (flag & PY_EXERT_SLOW) {
		if (randint0(100) < chance) {
			msg("You feel suddenly lethargic.");
			(void)player_inc_timed(p, TMD_SLOW, randint1(amount),
				true, true, false);
		}
	}

	/* HP */
	if (flag & PY_EXERT_HP) {
		if (randint0(100) < chance) {
			int dam = player_apply_damage_reduction(p,
				randint1(amount));
			char dam_text[32] = "";

			if (dam > 0 && OPT(p, show_damage)) {
				strnfmt(dam_text, sizeof(dam_text),
					" (%d)", dam);
			}
			msg("You cry out in sudden pain!%s", dam_text);
			take_hit(p, dam, "over-exertion");
		}
	}
}